

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O2

void get_msurf_descriptor_haar_unroll_6_6_False(integral_image *iimage,interest_point *ipoint)

{
  long lVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  byte bVar15;
  byte bVar16;
  byte bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int i;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  uint uVar34;
  ulong uVar35;
  ulong uVar36;
  int iVar37;
  int iVar38;
  ulong uVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  ulong uVar44;
  float *pfVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  float *pfVar49;
  float *pfVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar63;
  float fVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar79;
  float fVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [12];
  undefined1 auVar85 [64];
  float fVar87;
  undefined1 auVar88 [64];
  undefined1 in_ZMM8 [64];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar91;
  undefined1 auVar92 [64];
  
  auVar59._8_4_ = 0x3effffff;
  auVar59._0_8_ = 0x3effffff3effffff;
  auVar59._12_4_ = 0x3effffff;
  auVar88 = ZEXT1664(auVar59);
  auVar58._8_4_ = 0x80000000;
  auVar58._0_8_ = 0x8000000080000000;
  auVar58._12_4_ = 0x80000000;
  fVar64 = ipoint->scale;
  auVar92 = ZEXT464((uint)fVar64);
  auVar55 = ZEXT816(0x3fe0000000000000);
  auVar85 = ZEXT1664(auVar55);
  auVar60 = ZEXT416((uint)fVar64);
  auVar51 = vpternlogd_avx512vl(auVar59,auVar60,auVar58,0xf8);
  auVar51 = ZEXT416((uint)(fVar64 + auVar51._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  fVar63 = -0.08 / (fVar64 * fVar64);
  iVar37 = (int)auVar51._0_4_;
  auVar52._0_4_ = (int)auVar51._0_4_;
  auVar52._4_4_ = (int)auVar51._4_4_;
  auVar52._8_4_ = (int)auVar51._8_4_;
  auVar52._12_4_ = (int)auVar51._12_4_;
  auVar51 = vcvtdq2ps_avx(auVar52);
  auVar52 = vpternlogd_avx512vl(auVar59,ZEXT416((uint)ipoint->x),auVar58,0xf8);
  auVar52 = ZEXT416((uint)(ipoint->x + auVar52._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar53._0_8_ = (double)auVar52._0_4_;
  auVar53._8_8_ = auVar52._8_8_;
  auVar57._0_8_ = (double)fVar64;
  auVar57._8_8_ = 0;
  auVar52 = vfmadd231sd_fma(auVar53,auVar57,auVar55);
  auVar56._0_4_ = (float)auVar52._0_8_;
  auVar56._4_12_ = auVar52._4_12_;
  auVar52 = vpternlogd_avx512vl(auVar59,ZEXT416((uint)ipoint->y),auVar58,0xf8);
  fVar3 = auVar56._0_4_ - auVar51._0_4_;
  auVar52 = ZEXT416((uint)(ipoint->y + auVar52._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar54._0_8_ = (double)auVar52._0_4_;
  auVar54._8_8_ = auVar52._8_8_;
  auVar52 = vfmadd231sd_fma(auVar54,auVar57,auVar55);
  auVar55._0_4_ = (float)auVar52._0_8_;
  auVar55._4_12_ = auVar52._4_12_;
  fVar91 = auVar55._0_4_ - auVar51._0_4_;
  auVar53 = ZEXT416((uint)fVar64);
  auVar51 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar53,auVar56);
  auVar52 = vpternlogd_avx512vl(auVar59,auVar51,auVar58,0xf8);
  auVar51 = ZEXT416((uint)(auVar51._0_4_ + auVar52._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  if (iVar37 < (int)auVar51._0_4_) {
    auVar61._8_4_ = 0x3effffff;
    auVar61._0_8_ = 0x3effffff3effffff;
    auVar61._12_4_ = 0x3effffff;
    auVar62._8_4_ = 0x80000000;
    auVar62._0_8_ = 0x8000000080000000;
    auVar62._12_4_ = 0x80000000;
    auVar51 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar53,auVar55);
    auVar52 = vpternlogd_avx512vl(auVar62,auVar51,auVar61,0xea);
    auVar51 = ZEXT416((uint)(auVar51._0_4_ + auVar52._0_4_));
    auVar51 = vroundss_avx(auVar51,auVar51,0xb);
    if (iVar37 < (int)auVar51._0_4_) {
      auVar51 = vfmadd231ss_fma(auVar56,auVar53,ZEXT416(0x41300000));
      auVar83._8_4_ = 0x80000000;
      auVar83._0_8_ = 0x8000000080000000;
      auVar83._12_4_ = 0x80000000;
      auVar52 = vpternlogd_avx512vl(auVar83,auVar51,auVar61,0xea);
      auVar51 = ZEXT416((uint)(auVar51._0_4_ + auVar52._0_4_));
      auVar51 = vroundss_avx(auVar51,auVar51,0xb);
      if ((int)auVar51._0_4_ + iVar37 <= iimage->width) {
        auVar51 = vfmadd231ss_fma(auVar55,auVar53,ZEXT416(0x41300000));
        auVar13._8_4_ = 0x80000000;
        auVar13._0_8_ = 0x8000000080000000;
        auVar13._12_4_ = 0x80000000;
        auVar52 = vpternlogd_avx512vl(auVar61,auVar51,auVar13,0xf8);
        auVar51 = ZEXT416((uint)(auVar51._0_4_ + auVar52._0_4_));
        auVar51 = vroundss_avx(auVar51,auVar51,0xb);
        if ((int)auVar51._0_4_ + iVar37 <= iimage->height) {
          fVar3 = fVar3 + 0.5;
          fVar91 = fVar91 + 0.5;
          lVar47 = 0x120;
          for (uVar34 = 0xfffffff4; (int)uVar34 < 0xc; uVar34 = uVar34 + 6) {
            auVar51._0_4_ = (float)(int)uVar34;
            auVar86 = in_ZMM8._4_12_;
            auVar51._4_12_ = auVar86;
            auVar53 = auVar92._0_16_;
            auVar51 = vfmadd213ss_fma(auVar51,auVar53,ZEXT416((uint)fVar91));
            iVar24 = (int)auVar51._0_4_;
            auVar65._0_4_ = (float)(int)(uVar34 | 1);
            auVar65._4_12_ = auVar86;
            auVar51 = vfmadd213ss_fma(auVar65,auVar53,ZEXT416((uint)fVar91));
            iVar25 = (int)auVar51._0_4_;
            auVar66._0_4_ = (float)(int)(uVar34 + 2);
            auVar66._4_12_ = auVar86;
            auVar52 = ZEXT416((uint)fVar91);
            auVar51 = vfmadd213ss_fma(auVar66,auVar53,auVar52);
            iVar26 = (int)auVar51._0_4_;
            auVar67._0_4_ = (float)(int)(uVar34 + 3);
            auVar67._4_12_ = auVar86;
            auVar51 = vfmadd213ss_fma(auVar67,auVar53,auVar52);
            iVar27 = (int)auVar51._0_4_;
            auVar68._0_4_ = (float)(int)(uVar34 + 4);
            auVar68._4_12_ = auVar86;
            auVar51 = vfmadd213ss_fma(auVar68,auVar53,auVar52);
            iVar23 = (int)auVar51._0_4_;
            auVar69._0_4_ = (float)(int)(uVar34 + 5);
            auVar69._4_12_ = auVar86;
            auVar51 = vfmadd213ss_fma(auVar69,auVar53,auVar52);
            iVar22 = (int)auVar51._0_4_;
            lVar48 = lVar47;
            for (iVar33 = -0xc; iVar33 < 0xc; iVar33 = iVar33 + 6) {
              auVar70._0_4_ = (float)iVar33;
              auVar86 = auVar85._4_12_;
              auVar70._4_12_ = auVar86;
              auVar51 = vfmadd213ss_fma(auVar70,auVar60,ZEXT416((uint)fVar3));
              iVar32 = (int)auVar51._0_4_;
              auVar71._0_4_ = (float)(iVar33 + 1);
              auVar71._4_12_ = auVar86;
              auVar51 = vfmadd213ss_fma(auVar71,auVar60,ZEXT416((uint)fVar3));
              iVar38 = (int)auVar51._0_4_;
              auVar72._0_4_ = (float)(iVar33 + 2);
              auVar72._4_12_ = auVar86;
              auVar52 = ZEXT416((uint)fVar3);
              auVar51 = vfmadd213ss_fma(auVar72,auVar60,auVar52);
              iVar28 = (int)auVar51._0_4_;
              auVar73._0_4_ = (float)(iVar33 + 3);
              auVar73._4_12_ = auVar86;
              auVar51 = vfmadd213ss_fma(auVar73,auVar60,auVar52);
              iVar29 = (int)auVar51._0_4_;
              auVar74._0_4_ = (float)(iVar33 + 4);
              auVar74._4_12_ = auVar86;
              auVar51 = vfmadd213ss_fma(auVar74,auVar60,auVar52);
              iVar30 = (int)auVar51._0_4_;
              auVar75._0_4_ = (float)(iVar33 + 5);
              auVar75._4_12_ = auVar86;
              auVar51 = vfmadd213ss_fma(auVar75,auVar60,auVar52);
              iVar31 = (int)auVar51._0_4_;
              haarXY_unconditional
                        (iimage,iVar24,iVar32,iVar37,
                         (float *)((long)haarResponseX + lVar48 + -0x120),
                         (float *)((long)haarResponseY + lVar48 + -0x120));
              haarXY_unconditional
                        (iimage,iVar24,iVar38,iVar37,
                         (float *)((long)haarResponseX + lVar48 + -0x11c),
                         (float *)((long)haarResponseY + lVar48 + -0x11c));
              haarXY_unconditional
                        (iimage,iVar24,iVar28,iVar37,
                         (float *)((long)haarResponseX + lVar48 + -0x118),
                         (float *)((long)haarResponseY + lVar48 + -0x118));
              haarXY_unconditional
                        (iimage,iVar24,iVar29,iVar37,
                         (float *)((long)haarResponseX + lVar48 + -0x114),
                         (float *)((long)haarResponseY + lVar48 + -0x114));
              haarXY_unconditional
                        (iimage,iVar24,iVar30,iVar37,
                         (float *)((long)haarResponseX + lVar48 + -0x110),
                         (float *)((long)haarResponseY + lVar48 + -0x110));
              haarXY_unconditional
                        (iimage,iVar24,iVar31,iVar37,
                         (float *)((long)haarResponseX + lVar48 + -0x10c),
                         (float *)((long)haarResponseY + lVar48 + -0x10c));
              haarXY_unconditional
                        (iimage,iVar25,iVar32,iVar37,(float *)((long)haarResponseX + lVar48 + -0xc0)
                         ,(float *)((long)haarResponseY + lVar48 + -0xc0));
              haarXY_unconditional
                        (iimage,iVar25,iVar38,iVar37,(float *)((long)haarResponseX + lVar48 + -0xbc)
                         ,(float *)((long)haarResponseY + lVar48 + -0xbc));
              haarXY_unconditional
                        (iimage,iVar25,iVar28,iVar37,(float *)((long)haarResponseX + lVar48 + -0xb8)
                         ,(float *)((long)haarResponseY + lVar48 + -0xb8));
              haarXY_unconditional
                        (iimage,iVar25,iVar29,iVar37,(float *)((long)haarResponseX + lVar48 + -0xb4)
                         ,(float *)((long)haarResponseY + lVar48 + -0xb4));
              haarXY_unconditional
                        (iimage,iVar25,iVar30,iVar37,(float *)((long)haarResponseX + lVar48 + -0xb0)
                         ,(float *)((long)haarResponseY + lVar48 + -0xb0));
              haarXY_unconditional
                        (iimage,iVar25,iVar31,iVar37,(float *)((long)haarResponseX + lVar48 + -0xac)
                         ,(float *)((long)haarResponseY + lVar48 + -0xac));
              haarXY_unconditional
                        (iimage,iVar26,iVar32,iVar37,(float *)((long)haarResponseX + lVar48 + -0x60)
                         ,(float *)((long)haarResponseY + lVar48 + -0x60));
              haarXY_unconditional
                        (iimage,iVar26,iVar38,iVar37,(float *)((long)haarResponseX + lVar48 + -0x5c)
                         ,(float *)((long)haarResponseY + lVar48 + -0x5c));
              haarXY_unconditional
                        (iimage,iVar26,iVar28,iVar37,(float *)((long)haarResponseX + lVar48 + -0x58)
                         ,(float *)((long)haarResponseY + lVar48 + -0x58));
              haarXY_unconditional
                        (iimage,iVar26,iVar29,iVar37,(float *)((long)haarResponseX + lVar48 + -0x54)
                         ,(float *)((long)haarResponseY + lVar48 + -0x54));
              haarXY_unconditional
                        (iimage,iVar26,iVar30,iVar37,(float *)((long)haarResponseX + lVar48 + -0x50)
                         ,(float *)((long)haarResponseY + lVar48 + -0x50));
              haarXY_unconditional
                        (iimage,iVar26,iVar31,iVar37,(float *)((long)haarResponseX + lVar48 + -0x4c)
                         ,(float *)((long)haarResponseY + lVar48 + -0x4c));
              haarXY_unconditional
                        (iimage,iVar27,iVar32,iVar37,(float *)((long)haarResponseX + lVar48),
                         (float *)((long)haarResponseY + lVar48));
              haarXY_unconditional
                        (iimage,iVar27,iVar38,iVar37,(float *)((long)haarResponseX + lVar48 + 4),
                         (float *)((long)haarResponseY + lVar48 + 4));
              haarXY_unconditional
                        (iimage,iVar27,iVar28,iVar37,(float *)((long)haarResponseX + lVar48 + 8),
                         (float *)((long)haarResponseY + lVar48 + 8));
              haarXY_unconditional
                        (iimage,iVar27,iVar29,iVar37,(float *)((long)haarResponseX + lVar48 + 0xc),
                         (float *)((long)haarResponseY + lVar48 + 0xc));
              haarXY_unconditional
                        (iimage,iVar27,iVar30,iVar37,(float *)((long)haarResponseX + lVar48 + 0x10),
                         (float *)((long)haarResponseY + lVar48 + 0x10));
              haarXY_unconditional
                        (iimage,iVar27,iVar31,iVar37,(float *)((long)haarResponseX + lVar48 + 0x14),
                         (float *)((long)haarResponseY + lVar48 + 0x14));
              haarXY_unconditional
                        (iimage,iVar23,iVar32,iVar37,(float *)((long)haarResponseX + lVar48 + 0x60),
                         (float *)((long)haarResponseY + lVar48 + 0x60));
              haarXY_unconditional
                        (iimage,iVar23,iVar38,iVar37,(float *)((long)haarResponseX + lVar48 + 100),
                         (float *)((long)haarResponseY + lVar48 + 100));
              haarXY_unconditional
                        (iimage,iVar23,iVar28,iVar37,(float *)((long)haarResponseX + lVar48 + 0x68),
                         (float *)((long)haarResponseY + lVar48 + 0x68));
              haarXY_unconditional
                        (iimage,iVar23,iVar29,iVar37,(float *)((long)haarResponseX + lVar48 + 0x6c),
                         (float *)((long)haarResponseY + lVar48 + 0x6c));
              haarXY_unconditional
                        (iimage,iVar23,iVar30,iVar37,(float *)((long)haarResponseX + lVar48 + 0x70),
                         (float *)((long)haarResponseY + lVar48 + 0x70));
              haarXY_unconditional
                        (iimage,iVar23,iVar31,iVar37,(float *)((long)haarResponseX + lVar48 + 0x74),
                         (float *)((long)haarResponseY + lVar48 + 0x74));
              haarXY_unconditional
                        (iimage,iVar22,iVar32,iVar37,(float *)((long)haarResponseX + lVar48 + 0xc0),
                         (float *)((long)haarResponseY + lVar48 + 0xc0));
              haarXY_unconditional
                        (iimage,iVar22,iVar38,iVar37,(float *)((long)haarResponseX + lVar48 + 0xc4),
                         (float *)((long)haarResponseY + lVar48 + 0xc4));
              haarXY_unconditional
                        (iimage,iVar22,iVar28,iVar37,(float *)((long)haarResponseX + lVar48 + 200),
                         (float *)((long)haarResponseY + lVar48 + 200));
              haarXY_unconditional
                        (iimage,iVar22,iVar29,iVar37,(float *)((long)haarResponseX + lVar48 + 0xcc),
                         (float *)((long)haarResponseY + lVar48 + 0xcc));
              haarXY_unconditional
                        (iimage,iVar22,iVar30,iVar37,(float *)((long)haarResponseX + lVar48 + 0xd0),
                         (float *)((long)haarResponseY + lVar48 + 0xd0));
              haarXY_unconditional
                        (iimage,iVar22,iVar31,iVar37,(float *)((long)haarResponseX + lVar48 + 0xd4),
                         (float *)((long)haarResponseY + lVar48 + 0xd4));
              lVar48 = lVar48 + 0x18;
            }
            auVar92 = ZEXT1664(auVar60);
            lVar47 = lVar47 + 0x240;
          }
          goto LAB_001acf17;
        }
      }
    }
  }
  lVar47 = 0x120;
  for (uVar34 = 0xfffffff4; (int)uVar34 < 0xc; uVar34 = uVar34 + 6) {
    auVar51 = vpbroadcastd_avx512vl();
    auVar77._0_4_ = (float)(int)uVar34;
    auVar77._4_12_ = in_ZMM8._4_12_;
    auVar51 = vpaddd_avx(auVar51,_DAT_002716a0);
    auVar52 = vfmadd213ss_fma(auVar77,auVar92._0_16_,ZEXT416((uint)fVar91));
    auVar81._0_4_ = (float)(int)(uVar34 | 1);
    auVar81._4_12_ = in_ZMM8._4_12_;
    fVar76 = auVar52._0_4_;
    auVar52 = vfmadd213ss_fma(auVar81,auVar92._0_16_,ZEXT416((uint)fVar91));
    fVar79 = auVar52._0_4_;
    iVar22 = (int)((double)((ulong)(0.0 <= fVar76) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar76) * -0x4020000000000000) + (double)fVar76);
    auVar51 = vcvtdq2ps_avx(auVar51);
    iVar23 = (int)((double)((ulong)(0.0 <= fVar79) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar79) * -0x4020000000000000) + (double)fVar79);
    auVar21._4_4_ = fVar91;
    auVar21._0_4_ = fVar91;
    auVar21._8_4_ = fVar91;
    auVar21._12_4_ = fVar91;
    auVar18._4_4_ = fVar64;
    auVar18._0_4_ = fVar64;
    auVar18._8_4_ = fVar64;
    auVar18._12_4_ = fVar64;
    auVar52 = vfmadd132ps_fma(auVar51,auVar21,auVar18);
    uVar36 = vcmpps_avx512vl(auVar52,_DAT_002711c0,0xd);
    auVar51 = vshufps_avx(auVar52,auVar52,0xff);
    bVar15 = (byte)(uVar36 >> 3);
    bVar16 = (byte)(uVar36 >> 2);
    bVar17 = (byte)(uVar36 >> 1);
    iVar24 = (int)((double)((ulong)(bVar15 & 1) * 0x3fe0000000000000 +
                           (ulong)!(bool)(bVar15 & 1) * -0x4020000000000000) + (double)auVar51._0_4_
                  );
    auVar51 = vshufpd_avx(auVar52,auVar52,1);
    iVar25 = (int)((double)((ulong)(bVar16 & 1) * 0x3fe0000000000000 +
                           (ulong)!(bool)(bVar16 & 1) * -0x4020000000000000) + (double)auVar51._0_4_
                  );
    auVar51 = vmovshdup_avx(auVar52);
    iVar26 = (int)((double)((ulong)(bVar17 & 1) * 0x3fe0000000000000 +
                           (ulong)!(bool)(bVar17 & 1) * -0x4020000000000000) + (double)auVar51._0_4_
                  );
    iVar27 = (int)((double)((ulong)((byte)uVar36 & 1) * 0x3fe0000000000000 +
                           (ulong)!(bool)((byte)uVar36 & 1) * -0x4020000000000000) +
                  (double)auVar52._0_4_);
    lVar48 = lVar47;
    for (iVar33 = -0xc; iVar33 < 0xc; iVar33 = iVar33 + 6) {
      auVar51 = vpbroadcastd_avx512vl();
      auVar51 = vpaddd_avx(auVar51,_DAT_002716a0);
      auVar78._0_4_ = (float)iVar33;
      auVar78._4_12_ = auVar88._4_12_;
      auVar52 = vfmadd213ss_fma(auVar78,auVar60,ZEXT416((uint)fVar3));
      auVar82._0_4_ = (float)(iVar33 + 1);
      auVar82._4_12_ = auVar88._4_12_;
      auVar53 = vfmadd213ss_fma(auVar82,auVar60,ZEXT416((uint)fVar3));
      fVar76 = auVar52._0_4_;
      fVar79 = auVar53._0_4_;
      iVar38 = (int)((double)((ulong)(0.0 <= fVar76) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar76) * -0x4020000000000000) + (double)fVar76);
      auVar51 = vcvtdq2ps_avx(auVar51);
      iVar28 = (int)((double)((ulong)(0.0 <= fVar79) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar79) * -0x4020000000000000) + (double)fVar79);
      auVar20._4_4_ = fVar3;
      auVar20._0_4_ = fVar3;
      auVar20._8_4_ = fVar3;
      auVar20._12_4_ = fVar3;
      auVar19._4_4_ = fVar64;
      auVar19._0_4_ = fVar64;
      auVar19._8_4_ = fVar64;
      auVar19._12_4_ = fVar64;
      auVar52 = vfmadd132ps_fma(auVar51,auVar20,auVar19);
      uVar36 = vcmpps_avx512vl(auVar52,_DAT_002711c0,0xd);
      auVar51 = vshufps_avx(auVar52,auVar52,0xff);
      bVar15 = (byte)(uVar36 >> 3);
      bVar16 = (byte)(uVar36 >> 2);
      bVar17 = (byte)(uVar36 >> 1);
      iVar29 = (int)((double)((ulong)(bVar15 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar15 & 1) * -0x4020000000000000) +
                    (double)auVar51._0_4_);
      auVar51 = vshufpd_avx(auVar52,auVar52,1);
      iVar30 = (int)((double)((ulong)(bVar16 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar16 & 1) * -0x4020000000000000) +
                    (double)auVar51._0_4_);
      auVar51 = vmovshdup_avx(auVar52);
      iVar31 = (int)((double)((ulong)(bVar17 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar17 & 1) * -0x4020000000000000) +
                    (double)auVar51._0_4_);
      iVar32 = (int)((double)((ulong)((byte)uVar36 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)((byte)uVar36 & 1) * -0x4020000000000000) +
                    (double)auVar52._0_4_);
      haarXY_precheck_boundaries
                (iimage,iVar22,iVar38,iVar37,(float *)((long)haarResponseX + lVar48 + -0x120),
                 (float *)((long)haarResponseY + lVar48 + -0x120));
      haarXY_precheck_boundaries
                (iimage,iVar22,iVar28,iVar37,(float *)((long)haarResponseX + lVar48 + -0x11c),
                 (float *)((long)haarResponseY + lVar48 + -0x11c));
      haarXY_precheck_boundaries
                (iimage,iVar22,iVar29,iVar37,(float *)((long)haarResponseX + lVar48 + -0x118),
                 (float *)((long)haarResponseY + lVar48 + -0x118));
      haarXY_precheck_boundaries
                (iimage,iVar22,iVar30,iVar37,(float *)((long)haarResponseX + lVar48 + -0x114),
                 (float *)((long)haarResponseY + lVar48 + -0x114));
      haarXY_precheck_boundaries
                (iimage,iVar22,iVar31,iVar37,(float *)((long)haarResponseX + lVar48 + -0x110),
                 (float *)((long)haarResponseY + lVar48 + -0x110));
      haarXY_precheck_boundaries
                (iimage,iVar22,iVar32,iVar37,(float *)((long)haarResponseX + lVar48 + -0x10c),
                 (float *)((long)haarResponseY + lVar48 + -0x10c));
      haarXY_precheck_boundaries
                (iimage,iVar23,iVar38,iVar37,(float *)((long)haarResponseX + lVar48 + -0xc0),
                 (float *)((long)haarResponseY + lVar48 + -0xc0));
      haarXY_precheck_boundaries
                (iimage,iVar23,iVar28,iVar37,(float *)((long)haarResponseX + lVar48 + -0xbc),
                 (float *)((long)haarResponseY + lVar48 + -0xbc));
      haarXY_precheck_boundaries
                (iimage,iVar23,iVar29,iVar37,(float *)((long)haarResponseX + lVar48 + -0xb8),
                 (float *)((long)haarResponseY + lVar48 + -0xb8));
      haarXY_precheck_boundaries
                (iimage,iVar23,iVar30,iVar37,(float *)((long)haarResponseX + lVar48 + -0xb4),
                 (float *)((long)haarResponseY + lVar48 + -0xb4));
      haarXY_precheck_boundaries
                (iimage,iVar23,iVar31,iVar37,(float *)((long)haarResponseX + lVar48 + -0xb0),
                 (float *)((long)haarResponseY + lVar48 + -0xb0));
      haarXY_precheck_boundaries
                (iimage,iVar23,iVar32,iVar37,(float *)((long)haarResponseX + lVar48 + -0xac),
                 (float *)((long)haarResponseY + lVar48 + -0xac));
      haarXY_precheck_boundaries
                (iimage,iVar24,iVar38,iVar37,(float *)((long)haarResponseX + lVar48 + -0x60),
                 (float *)((long)haarResponseY + lVar48 + -0x60));
      haarXY_precheck_boundaries
                (iimage,iVar24,iVar28,iVar37,(float *)((long)haarResponseX + lVar48 + -0x5c),
                 (float *)((long)haarResponseY + lVar48 + -0x5c));
      haarXY_precheck_boundaries
                (iimage,iVar24,iVar29,iVar37,(float *)((long)haarResponseX + lVar48 + -0x58),
                 (float *)((long)haarResponseY + lVar48 + -0x58));
      haarXY_precheck_boundaries
                (iimage,iVar24,iVar30,iVar37,(float *)((long)haarResponseX + lVar48 + -0x54),
                 (float *)((long)haarResponseY + lVar48 + -0x54));
      haarXY_precheck_boundaries
                (iimage,iVar24,iVar31,iVar37,(float *)((long)haarResponseX + lVar48 + -0x50),
                 (float *)((long)haarResponseY + lVar48 + -0x50));
      haarXY_precheck_boundaries
                (iimage,iVar24,iVar32,iVar37,(float *)((long)haarResponseX + lVar48 + -0x4c),
                 (float *)((long)haarResponseY + lVar48 + -0x4c));
      haarXY_precheck_boundaries
                (iimage,iVar25,iVar38,iVar37,(float *)((long)haarResponseX + lVar48),
                 (float *)((long)haarResponseY + lVar48));
      haarXY_precheck_boundaries
                (iimage,iVar25,iVar28,iVar37,(float *)((long)haarResponseX + lVar48 + 4),
                 (float *)((long)haarResponseY + lVar48 + 4));
      haarXY_precheck_boundaries
                (iimage,iVar25,iVar29,iVar37,(float *)((long)haarResponseX + lVar48 + 8),
                 (float *)((long)haarResponseY + lVar48 + 8));
      haarXY_precheck_boundaries
                (iimage,iVar25,iVar30,iVar37,(float *)((long)haarResponseX + lVar48 + 0xc),
                 (float *)((long)haarResponseY + lVar48 + 0xc));
      haarXY_precheck_boundaries
                (iimage,iVar25,iVar31,iVar37,(float *)((long)haarResponseX + lVar48 + 0x10),
                 (float *)((long)haarResponseY + lVar48 + 0x10));
      haarXY_precheck_boundaries
                (iimage,iVar25,iVar32,iVar37,(float *)((long)haarResponseX + lVar48 + 0x14),
                 (float *)((long)haarResponseY + lVar48 + 0x14));
      haarXY_precheck_boundaries
                (iimage,iVar26,iVar38,iVar37,(float *)((long)haarResponseX + lVar48 + 0x60),
                 (float *)((long)haarResponseY + lVar48 + 0x60));
      haarXY_precheck_boundaries
                (iimage,iVar26,iVar28,iVar37,(float *)((long)haarResponseX + lVar48 + 100),
                 (float *)((long)haarResponseY + lVar48 + 100));
      haarXY_precheck_boundaries
                (iimage,iVar26,iVar29,iVar37,(float *)((long)haarResponseX + lVar48 + 0x68),
                 (float *)((long)haarResponseY + lVar48 + 0x68));
      haarXY_precheck_boundaries
                (iimage,iVar26,iVar30,iVar37,(float *)((long)haarResponseX + lVar48 + 0x6c),
                 (float *)((long)haarResponseY + lVar48 + 0x6c));
      haarXY_precheck_boundaries
                (iimage,iVar26,iVar31,iVar37,(float *)((long)haarResponseX + lVar48 + 0x70),
                 (float *)((long)haarResponseY + lVar48 + 0x70));
      haarXY_precheck_boundaries
                (iimage,iVar26,iVar32,iVar37,(float *)((long)haarResponseX + lVar48 + 0x74),
                 (float *)((long)haarResponseY + lVar48 + 0x74));
      haarXY_precheck_boundaries
                (iimage,iVar27,iVar38,iVar37,(float *)((long)haarResponseX + lVar48 + 0xc0),
                 (float *)((long)haarResponseY + lVar48 + 0xc0));
      haarXY_precheck_boundaries
                (iimage,iVar27,iVar28,iVar37,(float *)((long)haarResponseX + lVar48 + 0xc4),
                 (float *)((long)haarResponseY + lVar48 + 0xc4));
      haarXY_precheck_boundaries
                (iimage,iVar27,iVar29,iVar37,(float *)((long)haarResponseX + lVar48 + 200),
                 (float *)((long)haarResponseY + lVar48 + 200));
      haarXY_precheck_boundaries
                (iimage,iVar27,iVar30,iVar37,(float *)((long)haarResponseX + lVar48 + 0xcc),
                 (float *)((long)haarResponseY + lVar48 + 0xcc));
      haarXY_precheck_boundaries
                (iimage,iVar27,iVar31,iVar37,(float *)((long)haarResponseX + lVar48 + 0xd0),
                 (float *)((long)haarResponseY + lVar48 + 0xd0));
      haarXY_precheck_boundaries
                (iimage,iVar27,iVar32,iVar37,(float *)((long)haarResponseX + lVar48 + 0xd4),
                 (float *)((long)haarResponseY + lVar48 + 0xd4));
      lVar48 = lVar48 + 0x18;
    }
    auVar92 = ZEXT1664(auVar60);
    lVar47 = lVar47 + 0x240;
  }
LAB_001acf17:
  fVar91 = auVar92._0_4_;
  auVar90._8_4_ = 0x3effffff;
  auVar90._0_8_ = 0x3effffff3effffff;
  auVar90._12_4_ = 0x3effffff;
  auVar89._8_4_ = 0x80000000;
  auVar89._0_8_ = 0x8000000080000000;
  auVar89._12_4_ = 0x80000000;
  auVar51 = vpternlogd_avx512vl(auVar90,ZEXT416((uint)(fVar91 * 0.5)),auVar89,0xf8);
  auVar51 = ZEXT416((uint)(fVar91 * 0.5 + auVar51._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  auVar52 = vpternlogd_avx512vl(auVar90,ZEXT416((uint)(fVar91 * 1.5)),auVar89,0xf8);
  auVar52 = ZEXT416((uint)(fVar91 * 1.5 + auVar52._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar53 = vpternlogd_avx512vl(auVar90,ZEXT416((uint)(fVar91 * 2.5)),auVar89,0xf8);
  auVar53 = ZEXT416((uint)(fVar91 * 2.5 + auVar53._0_4_));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  auVar54 = vpternlogd_avx512vl(auVar90,ZEXT416((uint)(fVar91 * 3.5)),auVar89,0xf8);
  auVar54 = ZEXT416((uint)(fVar91 * 3.5 + auVar54._0_4_));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar55 = vpternlogd_avx512vl(auVar90,ZEXT416((uint)(fVar91 * 4.5)),auVar89,0xf8);
  auVar55 = ZEXT416((uint)(fVar91 * 4.5 + auVar55._0_4_));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  auVar56 = vpternlogd_avx512vl(auVar90,ZEXT416((uint)(fVar91 * 5.5)),auVar89,0xf8);
  auVar56 = ZEXT416((uint)(fVar91 * 5.5 + auVar56._0_4_));
  auVar56 = vroundss_avx(auVar56,auVar56,0xb);
  auVar57 = vpternlogd_avx512vl(auVar90,ZEXT416((uint)(fVar91 * 6.5)),auVar89,0xf8);
  auVar57 = ZEXT416((uint)(fVar91 * 6.5 + auVar57._0_4_));
  auVar57 = vroundss_avx(auVar57,auVar57,0xb);
  auVar58 = vpternlogd_avx512vl(auVar90,ZEXT416((uint)(fVar91 * 7.5)),auVar89,0xf8);
  auVar58 = ZEXT416((uint)(auVar58._0_4_ + fVar91 * 7.5));
  auVar58 = vroundss_avx(auVar58,auVar58,0xb);
  auVar59 = vpternlogd_avx512vl(auVar90,ZEXT416((uint)(fVar91 * 8.5)),auVar89,0xf8);
  auVar59 = ZEXT416((uint)(fVar91 * 8.5 + auVar59._0_4_));
  auVar59 = vroundss_avx(auVar59,auVar59,0xb);
  auVar60 = vpternlogd_avx512vl(auVar90,ZEXT416((uint)(fVar91 * 9.5)),auVar89,0xf8);
  auVar60 = ZEXT416((uint)(fVar91 * 9.5 + auVar60._0_4_));
  auVar60 = vroundss_avx(auVar60,auVar60,0xb);
  auVar61 = vpternlogd_avx512vl(auVar90,ZEXT416((uint)(fVar91 * 10.5)),auVar89,0xf8);
  auVar61 = ZEXT416((uint)(fVar91 * 10.5 + auVar61._0_4_));
  auVar61 = vroundss_avx(auVar61,auVar61,0xb);
  auVar62 = vpternlogd_avx512vl(auVar90,ZEXT416((uint)(fVar91 * 11.5)),auVar89,0xf8);
  fVar80 = auVar53._0_4_;
  fVar64 = fVar80 + auVar52._0_4_;
  fVar3 = fVar80 + auVar51._0_4_;
  auVar53 = ZEXT416((uint)(fVar91 * 11.5 + auVar62._0_4_));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  fVar91 = fVar80 - auVar51._0_4_;
  fVar76 = fVar80 - auVar52._0_4_;
  fVar79 = fVar80 - auVar54._0_4_;
  fVar4 = fVar80 - auVar55._0_4_;
  fVar5 = fVar80 - auVar56._0_4_;
  fVar80 = fVar80 - auVar57._0_4_;
  fVar87 = auVar58._0_4_;
  fVar6 = fVar87 - auVar54._0_4_;
  fVar7 = fVar87 - auVar55._0_4_;
  fVar8 = fVar87 - auVar56._0_4_;
  fVar9 = fVar87 - auVar57._0_4_;
  fVar10 = fVar87 - auVar59._0_4_;
  fVar11 = fVar87 - auVar60._0_4_;
  fVar12 = fVar87 - auVar61._0_4_;
  fVar87 = fVar87 - auVar53._0_4_;
  gauss_s1_c0[0] = expf(fVar64 * fVar64 * fVar63);
  gauss_s1_c0[1] = expf(fVar3 * fVar3 * fVar63);
  gauss_s1_c0[2] = expf(fVar91 * fVar91 * fVar63);
  gauss_s1_c0[3] = expf(fVar76 * fVar76 * fVar63);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar79 * fVar79 * fVar63);
  gauss_s1_c0[6] = expf(fVar4 * fVar4 * fVar63);
  gauss_s1_c0[7] = expf(fVar5 * fVar5 * fVar63);
  gauss_s1_c0[8] = expf(fVar80 * fVar80 * fVar63);
  gauss_s1_c1[0] = expf(fVar6 * fVar6 * fVar63);
  gauss_s1_c1[1] = expf(fVar7 * fVar7 * fVar63);
  gauss_s1_c1[2] = expf(fVar8 * fVar8 * fVar63);
  gauss_s1_c1[3] = expf(fVar9 * fVar9 * fVar63);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar10 * fVar10 * fVar63);
  gauss_s1_c1[6] = expf(fVar11 * fVar11 * fVar63);
  gauss_s1_c1[7] = expf(fVar12 * fVar12 * fVar63);
  gauss_s1_c1[8] = expf(fVar87 * fVar87 * fVar63);
  auVar85 = ZEXT1264(ZEXT812(0));
  lVar47 = 0;
  auVar60._8_4_ = 0x7fffffff;
  auVar60._0_8_ = 0x7fffffff7fffffff;
  auVar60._12_4_ = 0x7fffffff;
  iVar37 = 0;
  lVar48 = 0;
  uVar36 = 0xfffffffffffffff8;
  while (uVar34 = (uint)uVar36, (int)uVar34 < 8) {
    pfVar49 = gauss_s1_c1;
    if (uVar34 != 7) {
      pfVar49 = gauss_s1_c0;
    }
    lVar46 = (long)iVar37;
    lVar48 = (long)(int)lVar48;
    iVar37 = iVar37 + 4;
    if (uVar34 == 0xfffffff8) {
      pfVar49 = gauss_s1_c1;
    }
    uVar39 = 0;
    uVar44 = 0xfffffffffffffff8;
    lVar40 = lVar47;
    while (lVar46 != iVar37) {
      pfVar50 = gauss_s1_c1;
      iVar33 = (int)uVar44;
      if (iVar33 != 7) {
        pfVar50 = gauss_s1_c0;
      }
      auVar88 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar44 = (ulong)((uint)(uVar44 >> 0x1c) & 8);
      if (iVar33 == -8) {
        pfVar50 = gauss_s1_c1;
      }
      lVar41 = (long)haarResponseX + lVar40;
      lVar42 = (long)haarResponseY + lVar40;
      for (uVar35 = uVar39; uVar35 < iVar33 * 0x18 + 0x198; uVar35 = uVar35 + 0x18) {
        lVar43 = 0;
        pfVar45 = (float *)((long)pfVar49 + (ulong)(((uint)(uVar36 >> 0x1f) & 1) << 5));
        while (lVar43 != 9) {
          fVar64 = *pfVar45;
          pfVar45 = pfVar45 + (ulong)(~uVar34 >> 0x1f) * 2 + -1;
          lVar1 = lVar43 * 4;
          lVar2 = lVar43 * 4;
          lVar43 = lVar43 + 1;
          auVar53 = ZEXT416((uint)(pfVar50[uVar44] * fVar64 * *(float *)(lVar41 + lVar2)));
          auVar51 = vandps_avx(auVar53,auVar60);
          auVar54 = ZEXT416((uint)(pfVar50[uVar44] * fVar64 * *(float *)(lVar42 + lVar1)));
          auVar52 = vandps_avx(auVar54,auVar60);
          auVar53 = vinsertps_avx(auVar54,auVar53,0x10);
          auVar52 = vmovlhps_avx(auVar53,auVar52);
          auVar51 = vinsertps_avx(auVar52,auVar51,0x30);
          auVar88 = ZEXT1664(CONCAT412(auVar88._12_4_ + auVar51._12_4_,
                                       CONCAT48(auVar88._8_4_ + auVar51._8_4_,
                                                CONCAT44(auVar88._4_4_ + auVar51._4_4_,
                                                         auVar88._0_4_ + auVar51._0_4_))));
        }
        uVar44 = uVar44 + (ulong)(-1 < iVar33) * 2 + -1;
        lVar41 = lVar41 + 0x60;
        lVar42 = lVar42 + 0x60;
      }
      uVar44 = (ulong)(iVar33 + 5);
      uVar39 = uVar39 + 0x78;
      lVar40 = lVar40 + 0x1e0;
      fVar64 = gauss_s2_arr[lVar46];
      auVar14._4_4_ = fVar64;
      auVar14._0_4_ = fVar64;
      auVar14._8_4_ = fVar64;
      auVar14._12_4_ = fVar64;
      auVar54 = vmulps_avx512vl(auVar88._0_16_,auVar14);
      lVar46 = lVar46 + 1;
      auVar84._0_4_ = auVar54._0_4_ * auVar54._0_4_;
      auVar84._4_4_ = auVar54._4_4_ * auVar54._4_4_;
      auVar84._8_4_ = auVar54._8_4_ * auVar54._8_4_;
      auVar84._12_4_ = auVar54._12_4_ * auVar54._12_4_;
      auVar52 = vshufpd_avx(auVar54,auVar54,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar48) = auVar54;
      lVar48 = lVar48 + 4;
      auVar51 = vmovshdup_avx(auVar84);
      auVar53 = vfmadd231ss_fma(auVar51,auVar54,auVar54);
      auVar51 = vshufps_avx(auVar54,auVar54,0xff);
      auVar52 = vfmadd213ss_fma(auVar52,auVar52,auVar53);
      auVar51 = vfmadd213ss_fma(auVar51,auVar51,auVar52);
      auVar85 = ZEXT464((uint)(auVar85._0_4_ + auVar51._0_4_));
    }
    lVar47 = lVar47 + 0x14;
    uVar36 = (ulong)(uVar34 + 5);
  }
  if (auVar85._0_4_ < 0.0) {
    fVar64 = sqrtf(auVar85._0_4_);
  }
  else {
    auVar51 = vsqrtss_avx(auVar85._0_16_,auVar85._0_16_);
    fVar64 = auVar51._0_4_;
  }
  for (lVar47 = 0; lVar47 != 0x40; lVar47 = lVar47 + 1) {
    ipoint->descriptor[lVar47] = (1.0 / fVar64) * ipoint->descriptor[lVar47];
  }
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_6_6_False(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=6, l_count+=6) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l3 = l + 3;
            int l4 = l + 4;
            int l5 = l + 5;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int l_count3 = l_count + 3;
            int l_count4 = l_count + 4;
            int l_count5 = l_count + 5;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            float ipoint_y_sub_int_scale_add_l2_mul_scale = ipoint_y_sub_int_scale + l2 * scale;
            float ipoint_y_sub_int_scale_add_l3_mul_scale = ipoint_y_sub_int_scale + l3 * scale;
            float ipoint_y_sub_int_scale_add_l4_mul_scale = ipoint_y_sub_int_scale + l4 * scale;
            float ipoint_y_sub_int_scale_add_l5_mul_scale = ipoint_y_sub_int_scale + l5 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_l2_mul_scale + (ipoint_y_sub_int_scale_add_l2_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale3 = (int) (ipoint_y_sub_int_scale_add_l3_mul_scale + (ipoint_y_sub_int_scale_add_l3_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale4 = (int) (ipoint_y_sub_int_scale_add_l4_mul_scale + (ipoint_y_sub_int_scale_add_l4_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale5 = (int) (ipoint_y_sub_int_scale_add_l5_mul_scale + (ipoint_y_sub_int_scale_add_l5_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=6, k_count+=6) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                float ipoint_x_sub_int_scale_add_k4_mul_scale = ipoint_x_sub_int_scale + k4 * scale;
                float ipoint_x_sub_int_scale_add_k5_mul_scale = ipoint_x_sub_int_scale + k5 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_k3_mul_scale + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_k4_mul_scale + (ipoint_x_sub_int_scale_add_k4_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_k5_mul_scale + (ipoint_x_sub_int_scale_add_k5_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count2*24+k_count1], &haarResponseY[l_count2*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count2*24+k_count2], &haarResponseY[l_count2*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count2*24+k_count3], &haarResponseY[l_count2*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count2*24+k_count4], &haarResponseY[l_count2*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count2*24+k_count5], &haarResponseY[l_count2*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count3*24+k_count0], &haarResponseY[l_count3*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count3*24+k_count1], &haarResponseY[l_count3*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count3*24+k_count2], &haarResponseY[l_count3*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count3*24+k_count3], &haarResponseY[l_count3*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count3*24+k_count4], &haarResponseY[l_count3*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count3*24+k_count5], &haarResponseY[l_count3*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count4*24+k_count0], &haarResponseY[l_count4*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count4*24+k_count1], &haarResponseY[l_count4*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count4*24+k_count2], &haarResponseY[l_count4*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count4*24+k_count3], &haarResponseY[l_count4*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count4*24+k_count4], &haarResponseY[l_count4*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count4*24+k_count5], &haarResponseY[l_count4*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count5*24+k_count0], &haarResponseY[l_count5*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count5*24+k_count1], &haarResponseY[l_count5*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count5*24+k_count2], &haarResponseY[l_count5*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count5*24+k_count3], &haarResponseY[l_count5*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count5*24+k_count4], &haarResponseY[l_count5*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count5*24+k_count5], &haarResponseY[l_count5*24+k_count5]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=6, l_count+=6) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l3 = l + 3;
            int l4 = l + 4;
            int l5 = l + 5;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int l_count3 = l_count + 3;
            int l_count4 = l_count + 4;
            int l_count5 = l_count + 5;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_05 + l2 * scale);
            int sample_y_sub_int_scale3 = (int) (ipoint_y_sub_int_scale_add_05 + l3 * scale);
            int sample_y_sub_int_scale4 = (int) (ipoint_y_sub_int_scale_add_05 + l4 * scale);
            int sample_y_sub_int_scale5 = (int) (ipoint_y_sub_int_scale_add_05 + l5 * scale);

            for (int k=-12, k_count=0; k<12; k+=6, k_count+=6) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_05 + k4 * scale);
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_05 + k5 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count2*24+k_count1], &haarResponseY[l_count2*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count2*24+k_count2], &haarResponseY[l_count2*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count2*24+k_count3], &haarResponseY[l_count2*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count2*24+k_count4], &haarResponseY[l_count2*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count2*24+k_count5], &haarResponseY[l_count2*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count3*24+k_count0], &haarResponseY[l_count3*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count3*24+k_count1], &haarResponseY[l_count3*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count3*24+k_count2], &haarResponseY[l_count3*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count3*24+k_count3], &haarResponseY[l_count3*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count3*24+k_count4], &haarResponseY[l_count3*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count3*24+k_count5], &haarResponseY[l_count3*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count4*24+k_count0], &haarResponseY[l_count4*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count4*24+k_count1], &haarResponseY[l_count4*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count4*24+k_count2], &haarResponseY[l_count4*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count4*24+k_count3], &haarResponseY[l_count4*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count4*24+k_count4], &haarResponseY[l_count4*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count4*24+k_count5], &haarResponseY[l_count4*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count5*24+k_count0], &haarResponseY[l_count5*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count5*24+k_count1], &haarResponseY[l_count5*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count5*24+k_count2], &haarResponseY[l_count5*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count5*24+k_count3], &haarResponseY[l_count5*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count5*24+k_count4], &haarResponseY[l_count5*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count5*24+k_count5], &haarResponseY[l_count5*24+k_count5]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}